

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

int __thiscall ON_BinaryArchive::GetCurrentChunk(ON_BinaryArchive *this,ON_3DM_CHUNK *chunk)

{
  bool bVar1;
  ON__UINT32 local_48;
  int local_44;
  ON__INT32 i32;
  int rc;
  ON_3DM_BIG_CHUNK big_chunk;
  ON_3DM_CHUNK *chunk_local;
  ON_BinaryArchive *this_local;
  
  big_chunk._32_8_ = chunk;
  ON_3DM_BIG_CHUNK::ON_3DM_BIG_CHUNK((ON_3DM_BIG_CHUNK *)&i32);
  memset((void *)big_chunk._32_8_,0,0x20);
  memset(&i32,0,0x28);
  local_44 = GetCurrentChunk(this,(ON_3DM_BIG_CHUNK *)&i32);
  if (0 < local_44) {
    *(ON__UINT64 *)big_chunk._32_8_ = _i32;
    *(ON__UINT32 *)(big_chunk._32_8_ + 8) = (ON__UINT32)big_chunk.m_big_value;
    local_48 = 0;
    bVar1 = ON_IsLongChunkTypecode((ON__UINT32)big_chunk.m_big_value);
    if (bVar1) {
      DownSizeUINT(big_chunk.m_end_offset,&local_48);
    }
    else {
      DownSizeINT(big_chunk.m_end_offset,(ON__INT32 *)&local_48);
    }
    *(ON__UINT32 *)(big_chunk._32_8_ + 0xc) = local_48;
    *(uint *)(big_chunk._32_8_ + 0x10) = (uint)(big_chunk.m_big_value._4_1_ != '\0');
    *(ushort *)(big_chunk._32_8_ + 0x14) = (ushort)((char)big_chunk.m_typecode != '\0');
    *(uint *)(big_chunk._32_8_ + 0x18) = (uint)(big_chunk.m_typecode._1_1_ != '\0');
    *(undefined2 *)(big_chunk._32_8_ + 0x16) = big_chunk.m_typecode._2_2_;
    *(undefined4 *)(big_chunk._32_8_ + 0x1c) = big_chunk._28_4_;
  }
  return local_44;
}

Assistant:

int ON_BinaryArchive::GetCurrentChunk(ON_3DM_CHUNK& chunk) const
{
  ON_3DM_BIG_CHUNK big_chunk;
  memset(&chunk,0,sizeof(ON_3DM_CHUNK));
  memset(&big_chunk,0,sizeof(big_chunk));
  int rc = GetCurrentChunk(big_chunk);
  if ( rc > 0 )
  {
    chunk.m_offset = (size_t)big_chunk.m_start_offset;
    chunk.m_typecode = big_chunk.m_typecode;

    ON__INT32 i32 = 0;
    if ( ON_IsLongChunkTypecode( big_chunk.m_typecode ) )
      DownSizeUINT( (ON__UINT64)big_chunk.m_big_value, (ON__UINT32*)&i32 );
    else
      DownSizeINT( big_chunk.m_big_value, &i32 );
    chunk.m_value = i32;

    chunk.m_do_length = big_chunk.m_bLongChunk ? 1 : 0;
    chunk.m_do_crc16 = big_chunk.m_do_crc16 ? 1 : 0;
    chunk.m_do_crc32 = big_chunk.m_do_crc32 ? 1 : 0;
    chunk.m_crc16 = big_chunk.m_crc16;
    chunk.m_crc32 = big_chunk.m_crc32;
  }
  return rc;
}